

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

char * lys_stmt_str(ly_stmt stmt)

{
  char *pcStack_10;
  ly_stmt stmt_local;
  
  if (stmt == LY_STMT_NONE) {
    pcStack_10 = (char *)0x0;
  }
  else if (stmt == LY_STMT_NOTIFICATION) {
    pcStack_10 = "notification";
  }
  else if (stmt == LY_STMT_INPUT) {
    pcStack_10 = "input";
  }
  else if (stmt == LY_STMT_OUTPUT) {
    pcStack_10 = "output";
  }
  else if (stmt == LY_STMT_ACTION) {
    pcStack_10 = "action";
  }
  else if (stmt == LY_STMT_RPC) {
    pcStack_10 = "rpc";
  }
  else if (stmt == LY_STMT_ANYDATA) {
    pcStack_10 = "anydata";
  }
  else if (stmt == LY_STMT_ANYXML) {
    pcStack_10 = "anyxml";
  }
  else if (stmt == LY_STMT_AUGMENT) {
    pcStack_10 = "augment";
  }
  else if (stmt == LY_STMT_CASE) {
    pcStack_10 = "case";
  }
  else if (stmt == LY_STMT_CHOICE) {
    pcStack_10 = "choice";
  }
  else if (stmt == LY_STMT_CONTAINER) {
    pcStack_10 = "container";
  }
  else if (stmt == LY_STMT_GROUPING) {
    pcStack_10 = "grouping";
  }
  else if (stmt == LY_STMT_LEAF) {
    pcStack_10 = "leaf";
  }
  else if (stmt == LY_STMT_LEAF_LIST) {
    pcStack_10 = "leaf-list";
  }
  else if (stmt == LY_STMT_LIST) {
    pcStack_10 = "list";
  }
  else if (stmt == LY_STMT_USES) {
    pcStack_10 = "uses";
  }
  else if (stmt == LY_STMT_ARGUMENT) {
    pcStack_10 = "argument";
  }
  else if (stmt == LY_STMT_BASE) {
    pcStack_10 = "base";
  }
  else if (stmt == LY_STMT_BELONGS_TO) {
    pcStack_10 = "belongs-to";
  }
  else if (stmt == LY_STMT_BIT) {
    pcStack_10 = "bit";
  }
  else if (stmt == LY_STMT_CONFIG) {
    pcStack_10 = "config";
  }
  else if (stmt == LY_STMT_CONTACT) {
    pcStack_10 = "contact";
  }
  else if (stmt == LY_STMT_DEFAULT) {
    pcStack_10 = "default";
  }
  else if (stmt == LY_STMT_DESCRIPTION) {
    pcStack_10 = "description";
  }
  else if (stmt == LY_STMT_DEVIATE) {
    pcStack_10 = "deviate";
  }
  else if (stmt == LY_STMT_DEVIATION) {
    pcStack_10 = "deviation";
  }
  else if (stmt == LY_STMT_ENUM) {
    pcStack_10 = "enum";
  }
  else if (stmt == LY_STMT_ERROR_APP_TAG) {
    pcStack_10 = "error-app-tag";
  }
  else if (stmt == LY_STMT_ERROR_MESSAGE) {
    pcStack_10 = "error-message";
  }
  else if (stmt == LY_STMT_EXTENSION) {
    pcStack_10 = "extension";
  }
  else if (stmt == LY_STMT_EXTENSION_INSTANCE) {
    pcStack_10 = (char *)0x0;
  }
  else if (stmt == LY_STMT_FEATURE) {
    pcStack_10 = "feature";
  }
  else if (stmt == LY_STMT_FRACTION_DIGITS) {
    pcStack_10 = "fraction-digits";
  }
  else if (stmt == LY_STMT_IDENTITY) {
    pcStack_10 = "identity";
  }
  else if (stmt == LY_STMT_IF_FEATURE) {
    pcStack_10 = "if-feature";
  }
  else if (stmt == LY_STMT_IMPORT) {
    pcStack_10 = "import";
  }
  else if (stmt == LY_STMT_INCLUDE) {
    pcStack_10 = "include";
  }
  else if (stmt == LY_STMT_KEY) {
    pcStack_10 = "key";
  }
  else if (stmt == LY_STMT_LENGTH) {
    pcStack_10 = "length";
  }
  else if (stmt == LY_STMT_MANDATORY) {
    pcStack_10 = "mandatory";
  }
  else if (stmt == LY_STMT_MAX_ELEMENTS) {
    pcStack_10 = "max-elements";
  }
  else if (stmt == LY_STMT_MIN_ELEMENTS) {
    pcStack_10 = "min-elements";
  }
  else if (stmt == LY_STMT_MODIFIER) {
    pcStack_10 = "modifier";
  }
  else if (stmt == LY_STMT_MODULE) {
    pcStack_10 = "module";
  }
  else if (stmt == LY_STMT_MUST) {
    pcStack_10 = "must";
  }
  else if (stmt == LY_STMT_NAMESPACE) {
    pcStack_10 = "namespace";
  }
  else if (stmt == LY_STMT_ORDERED_BY) {
    pcStack_10 = "ordered-by";
  }
  else if (stmt == LY_STMT_ORGANIZATION) {
    pcStack_10 = "organization";
  }
  else if (stmt == LY_STMT_PATH) {
    pcStack_10 = "path";
  }
  else if (stmt == LY_STMT_PATTERN) {
    pcStack_10 = "pattern";
  }
  else if (stmt == LY_STMT_POSITION) {
    pcStack_10 = "position";
  }
  else if (stmt == LY_STMT_PREFIX) {
    pcStack_10 = "prefix";
  }
  else if (stmt == LY_STMT_PRESENCE) {
    pcStack_10 = "presence";
  }
  else if (stmt == LY_STMT_RANGE) {
    pcStack_10 = "range";
  }
  else if (stmt == LY_STMT_REFERENCE) {
    pcStack_10 = "reference";
  }
  else if (stmt == LY_STMT_REFINE) {
    pcStack_10 = "refine";
  }
  else if (stmt == LY_STMT_REQUIRE_INSTANCE) {
    pcStack_10 = "require-instance";
  }
  else if (stmt == LY_STMT_REVISION) {
    pcStack_10 = "revision";
  }
  else if (stmt == LY_STMT_REVISION_DATE) {
    pcStack_10 = "revision-date";
  }
  else if (stmt == LY_STMT_STATUS) {
    pcStack_10 = "status";
  }
  else if (stmt == LY_STMT_SUBMODULE) {
    pcStack_10 = "submodule";
  }
  else if (stmt == LY_STMT_TYPE) {
    pcStack_10 = "type";
  }
  else if (stmt == LY_STMT_TYPEDEF) {
    pcStack_10 = "typedef";
  }
  else if (stmt == LY_STMT_UNIQUE) {
    pcStack_10 = "unique";
  }
  else if (stmt == LY_STMT_UNITS) {
    pcStack_10 = "units";
  }
  else if (stmt == LY_STMT_VALUE) {
    pcStack_10 = "value";
  }
  else if (stmt == LY_STMT_WHEN) {
    pcStack_10 = "when";
  }
  else if (stmt == LY_STMT_YANG_VERSION) {
    pcStack_10 = "yang-version";
  }
  else if (stmt == LY_STMT_YIN_ELEMENT) {
    pcStack_10 = "yin-element";
  }
  else if (stmt == LY_STMT_SYNTAX_SEMICOLON) {
    pcStack_10 = ";";
  }
  else if (stmt == LY_STMT_SYNTAX_LEFT_BRACE) {
    pcStack_10 = "{";
  }
  else if (stmt == LY_STMT_SYNTAX_RIGHT_BRACE) {
    pcStack_10 = "}";
  }
  else if (stmt == LY_STMT_ARG_TEXT) {
    pcStack_10 = "text";
  }
  else if (stmt == LY_STMT_ARG_VALUE) {
    pcStack_10 = "value";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *
lys_stmt_str(enum ly_stmt stmt)
{
    switch (stmt) {
    case LY_STMT_NONE:
        return NULL;
    case LY_STMT_ACTION:
        return "action";
    case LY_STMT_ANYDATA:
        return "anydata";
    case LY_STMT_ANYXML:
        return "anyxml";
    case LY_STMT_ARGUMENT:
        return "argument";
    case LY_STMT_ARG_TEXT:
        return "text";
    case LY_STMT_ARG_VALUE:
        return "value";
    case LY_STMT_AUGMENT:
        return "augment";
    case LY_STMT_BASE:
        return "base";
    case LY_STMT_BELONGS_TO:
        return "belongs-to";
    case LY_STMT_BIT:
        return "bit";
    case LY_STMT_CASE:
        return "case";
    case LY_STMT_CHOICE:
        return "choice";
    case LY_STMT_CONFIG:
        return "config";
    case LY_STMT_CONTACT:
        return "contact";
    case LY_STMT_CONTAINER:
        return "container";
    case LY_STMT_DEFAULT:
        return "default";
    case LY_STMT_DESCRIPTION:
        return "description";
    case LY_STMT_DEVIATE:
        return "deviate";
    case LY_STMT_DEVIATION:
        return "deviation";
    case LY_STMT_ENUM:
        return "enum";
    case LY_STMT_ERROR_APP_TAG:
        return "error-app-tag";
    case LY_STMT_ERROR_MESSAGE:
        return "error-message";
    case LY_STMT_EXTENSION:
        return "extension";
    case LY_STMT_EXTENSION_INSTANCE:
        return NULL;
    case LY_STMT_FEATURE:
        return "feature";
    case LY_STMT_FRACTION_DIGITS:
        return "fraction-digits";
    case LY_STMT_GROUPING:
        return "grouping";
    case LY_STMT_IDENTITY:
        return "identity";
    case LY_STMT_IF_FEATURE:
        return "if-feature";
    case LY_STMT_IMPORT:
        return "import";
    case LY_STMT_INCLUDE:
        return "include";
    case LY_STMT_INPUT:
        return "input";
    case LY_STMT_KEY:
        return "key";
    case LY_STMT_LEAF:
        return "leaf";
    case LY_STMT_LEAF_LIST:
        return "leaf-list";
    case LY_STMT_LENGTH:
        return "length";
    case LY_STMT_LIST:
        return "list";
    case LY_STMT_MANDATORY:
        return "mandatory";
    case LY_STMT_MAX_ELEMENTS:
        return "max-elements";
    case LY_STMT_MIN_ELEMENTS:
        return "min-elements";
    case LY_STMT_MODIFIER:
        return "modifier";
    case LY_STMT_MODULE:
        return "module";
    case LY_STMT_MUST:
        return "must";
    case LY_STMT_NAMESPACE:
        return "namespace";
    case LY_STMT_NOTIFICATION:
        return "notification";
    case LY_STMT_ORDERED_BY:
        return "ordered-by";
    case LY_STMT_ORGANIZATION:
        return "organization";
    case LY_STMT_OUTPUT:
        return "output";
    case LY_STMT_PATH:
        return "path";
    case LY_STMT_PATTERN:
        return "pattern";
    case LY_STMT_POSITION:
        return "position";
    case LY_STMT_PREFIX:
        return "prefix";
    case LY_STMT_PRESENCE:
        return "presence";
    case LY_STMT_RANGE:
        return "range";
    case LY_STMT_REFERENCE:
        return "reference";
    case LY_STMT_REFINE:
        return "refine";
    case LY_STMT_REQUIRE_INSTANCE:
        return "require-instance";
    case LY_STMT_REVISION:
        return "revision";
    case LY_STMT_REVISION_DATE:
        return "revision-date";
    case LY_STMT_RPC:
        return "rpc";
    case LY_STMT_STATUS:
        return "status";
    case LY_STMT_SUBMODULE:
        return "submodule";
    case LY_STMT_SYNTAX_LEFT_BRACE:
        return "{";
    case LY_STMT_SYNTAX_RIGHT_BRACE:
        return "}";
    case LY_STMT_SYNTAX_SEMICOLON:
        return ";";
    case LY_STMT_TYPE:
        return "type";
    case LY_STMT_TYPEDEF:
        return "typedef";
    case LY_STMT_UNIQUE:
        return "unique";
    case LY_STMT_UNITS:
        return "units";
    case LY_STMT_USES:
        return "uses";
    case LY_STMT_VALUE:
        return "value";
    case LY_STMT_WHEN:
        return "when";
    case LY_STMT_YANG_VERSION:
        return "yang-version";
    case LY_STMT_YIN_ELEMENT:
        return "yin-element";
    }

    return NULL;
}